

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O2

void __thiscall
ut11::Mock<int(char)>::VerifyTimes<int,char>
          (Mock<int(char)> *this,size_t param_2,string *param_3,int *param_4,char *param_5)

{
  size_t actual;
  string sStack_68;
  string local_48;
  
  actual = detail::MockArgumentHandler<char>::CountCalls<char>
                     ((MockArgumentHandler<char> *)(this + 0x20),*param_5);
  if (actual != (long)*param_4) {
    std::__cxx11::string::string((string *)&local_48,param_3);
    GetVerifyFailTimesMessageForCount_abi_cxx11_(&sStack_68,this,(long)*param_4,actual);
    Assert::Fail(param_2,&local_48,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void VerifyTimes(std::true_type isOperand, std::size_t line, std::string file, const Count& count, const Expectations&... expectations) const
		{
			auto actual = m_argumentHandler.CountCalls(expectations...);
			if ( actual != count )
				Assert::Fail(line, file, GetVerifyFailTimesMessageForCount(count, actual));
		}